

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

int capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init(EVP_PKEY_CTX *ctx)

{
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  undefined8 uVar3;
  ElementSize elementSize;
  Which elementType;
  uint uVar4;
  ushort uVar5;
  ElementCount in_ECX;
  undefined8 in_RDX;
  ulong in_RSI;
  ListBuilder *__return_storage_ptr__;
  Type local_c8;
  Schema local_b8;
  Reader local_b0;
  ListBuilder local_80;
  ListBuilder local_58;
  
  if ((Which)in_RSI == STRUCT && (in_RSI & 0xff0000) == 0) {
    local_b8.raw = (RawBrandedSchema *)Type::asStruct(&local_c8);
    Schema::getProto(&local_b0,&local_b8);
    uVar4 = 0;
    if (local_b0._reader.dataSize < 0x80) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)((long)local_b0._reader.data + 0xe);
      if (0xcf < local_b0._reader.dataSize) {
        uVar4 = (uint)*(ushort *)((long)local_b0._reader.data + 0x18) << 0x10;
      }
    }
    __return_storage_ptr__ = &local_58;
    PointerBuilder::initStructList
              (__return_storage_ptr__,(PointerBuilder *)&stack0x00000008,in_ECX,
               (StructSize)(uVar5 | uVar4));
  }
  else {
    elementType = LIST;
    if ((in_RSI & 0xff0000) == 0) {
      elementType = (Which)in_RSI;
    }
    elementSize = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr__ = &local_80;
    PointerBuilder::initList
              (__return_storage_ptr__,(PointerBuilder *)&stack0x00000008,elementSize,in_ECX);
  }
  *(undefined8 *)(ctx + 0x30) = *(undefined8 *)&__return_storage_ptr__->structDataSize;
  pSVar1 = __return_storage_ptr__->segment;
  pCVar2 = __return_storage_ptr__->capTable;
  uVar3 = *(undefined8 *)&__return_storage_ptr__->elementCount;
  *(byte **)(ctx + 0x20) = __return_storage_ptr__->ptr;
  *(undefined8 *)(ctx + 0x28) = uVar3;
  *(SegmentBuilder **)(ctx + 0x10) = pSVar1;
  *(CapTableBuilder **)(ctx + 0x18) = pCVar2;
  *(ulong *)ctx = in_RSI;
  *(undefined8 *)(ctx + 8) = in_RDX;
  return (int)ctx;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::init(
    PointerBuilder builder, ListSchema schema, uint size) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.initStructList(bounded(size) * ELEMENTS,
            structSizeFromSchema(schema.getStructElementType())));
  } else {
    return DynamicList::Builder(schema,
        builder.initList(elementSizeFor(schema.whichElementType()), bounded(size) * ELEMENTS));
  }
}